

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O1

double __thiscall
simpleExpressionEvaluator::ExpressionEvaluator::_identifier(ExpressionEvaluator *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  VariableTable *this_00;
  char *pcVar5;
  int iVar6;
  string variable;
  double value;
  char *local_c0;
  long local_b8;
  char local_b0;
  undefined7 uStack_af;
  double local_a0;
  double local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_c0 = &local_b0;
  local_b8 = 0;
  local_b0 = '\0';
  iVar2 = isalnum(this->_token);
  if (iVar2 != 0) {
    do {
      std::__cxx11::string::push_back((char)&local_c0);
      iVar2 = this->_index;
      pcVar5 = (this->_expression)._M_dataplus._M_p + iVar2;
      do {
        iVar2 = iVar2 + 1;
        pcVar5 = pcVar5 + 1;
        this->_index = iVar2;
        iVar6 = (int)*pcVar5;
        iVar3 = isspace(iVar6);
      } while (iVar3 != 0);
      this->_token = iVar6;
      iVar2 = isalnum(iVar6);
    } while (iVar2 != 0);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_c0,local_c0 + local_b8);
  this_00 = &this->_variableTable;
  bVar1 = VariableTable::exists(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nVariable token : ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_c0,local_b8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Enter its value : ",0x12);
    std::istream::_M_extract<double>((double *)&std::cin);
    std::istream::ignore();
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_c0,local_c0 + local_b8);
    VariableTable::addVariable(this_00,&local_70,local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_c0,local_c0 + local_b8);
  local_a0 = VariableTable::getVariable(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  return local_a0;
}

Assistant:

double ExpressionEvaluator::_identifier()
{
	/* identifier -> alphabet { alphabet | digit } */

	int j = 0;
	string variable;

	while (isalnum(_token))
	{
		variable += _token;
		j++;
		_getToken();
	}
	if (!_variableTable.exists(variable))
	{
		double value;
		cout << "\nVariable token : " << variable;
		cout << endl << "Enter its value : ";
		cin >> value;
		cin.ignore();
		_variableTable.addVariable(variable, value);
	}
	return _variableTable.getVariable(variable);
}